

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *
fmt::v7::detail::
make_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,fmt::v7::basic_string_view<char>>
          (basic_string_view<char> *value)

{
  size_t sVar1;
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *in_RDI;
  basic_string_view<char> bVar2;
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *arg;
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *val;
  arg_mapper<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *in_stack_ffffffffffffffb0;
  char *local_48;
  size_t local_40;
  char *local_38 [4];
  char **local_18;
  basic_string_view<char> local_10;
  
  val = in_RDI;
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_arg(in_RDI);
  in_RDI->type_ = string_type;
  bVar2 = arg_mapper<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
          map<fmt::v7::basic_string_view<char>,_0>
                    (in_stack_ffffffffffffffb0,(basic_string_view<char> *)val);
  local_48 = bVar2.data_;
  local_40 = bVar2.size_;
  local_10.data_ = local_48;
  local_10.size_ = local_40;
  local_18 = local_38;
  local_38[0] = basic_string_view<char>::data(&local_10);
  sVar1 = basic_string_view<char>::size(&local_10);
  (in_RDI->value_).field_0.string.data = local_38[0];
  (in_RDI->value_).field_0.string.size = sVar1;
  return val;
}

Assistant:

FMT_CONSTEXPR basic_format_arg<Context> make_arg(const T& value) {
  basic_format_arg<Context> arg;
  arg.type_ = mapped_type_constant<T, Context>::value;
  arg.value_ = arg_mapper<Context>().map(value);
  return arg;
}